

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O0

void triphone_add(mdef_t *m,int ci,int lc,int rc,word_posn_t wpos,int p)

{
  ph_rc_s *ppVar1;
  char local_1038 [8];
  char buf [4096];
  ph_rc_t *rcptr;
  ph_lc_t *lcptr;
  int p_local;
  word_posn_t wpos_local;
  int rc_local;
  int lc_local;
  int ci_local;
  mdef_t *m_local;
  
  if (m->n_phone <= p) {
    __assert_fail("p < m->n_phone",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                  ,0x8b,"void triphone_add(mdef_t *, int, int, int, word_posn_t, int)");
  }
  m->phone[p].ci = (int16)ci;
  m->phone[p].lc = (int16)lc;
  m->phone[p].rc = (int16)rc;
  m->phone[p].wpos = wpos;
  if (m->n_ciphone <= p) {
    rcptr = (ph_rc_t *)find_ph_lc(m->wpos_ci_lclist[wpos][ci],lc);
    if ((ph_lc_t *)rcptr == (ph_lc_t *)0x0) {
      rcptr = (ph_rc_t *)
              __ckd_calloc__(1,0x18,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                             ,0x97);
      ((ph_lc_t *)rcptr)->lc = (int16)lc;
      ((ph_lc_t *)rcptr)->next = m->wpos_ci_lclist[wpos][ci];
      m->wpos_ci_lclist[wpos][ci] = (ph_lc_t *)rcptr;
    }
    buf._4088_8_ = find_ph_rc(rcptr->next,rc);
    if ((ph_rc_t *)buf._4088_8_ != (ph_rc_t *)0x0) {
      mdef_phone_str(m,((ph_rc_t *)buf._4088_8_)->pid,local_1038);
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0xa0,"Duplicate triphone: %s\n",local_1038);
      exit(1);
    }
    ppVar1 = (ph_rc_s *)
             __ckd_calloc__(1,0x10,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                            ,0xa3);
    ppVar1->rc = (int16)rc;
    ppVar1->pid = p;
    ppVar1->next = rcptr->next;
    rcptr->next = ppVar1;
  }
  return;
}

Assistant:

static void
triphone_add(mdef_t * m,
             int ci, int lc, int rc, word_posn_t wpos,
             int p)
{
    ph_lc_t *lcptr;
    ph_rc_t *rcptr;

    assert(p < m->n_phone);

    /* Fill in phone[p] information (state and tmat mappings added later) */
    m->phone[p].ci = ci;
    m->phone[p].lc = lc;
    m->phone[p].rc = rc;
    m->phone[p].wpos = wpos;

    /* Create <ci,lc,rc,wpos> -> p mapping if not a CI phone */
    if (p >= m->n_ciphone) {
        if ((lcptr = find_ph_lc(m->wpos_ci_lclist[wpos][(int) ci], lc))
            == NULL) {
            lcptr = (ph_lc_t *) ckd_calloc(1, sizeof(ph_lc_t)); /* freed at mdef_free, I believe */
            lcptr->lc = lc;
            lcptr->next = m->wpos_ci_lclist[wpos][(int) ci];
            m->wpos_ci_lclist[wpos][(int) ci] = lcptr;  /* This is what needs to be freed */
        }
        if ((rcptr = find_ph_rc(lcptr->rclist, rc)) != NULL) {
            __BIGSTACKVARIABLE__ char buf[4096];

            mdef_phone_str(m, rcptr->pid, buf);
            E_FATAL("Duplicate triphone: %s\n", buf);
        }

        rcptr = (ph_rc_t *) ckd_calloc(1, sizeof(ph_rc_t));     /* freed in mdef_free, I believe */
        rcptr->rc = rc;
        rcptr->pid = p;
        rcptr->next = lcptr->rclist;
        lcptr->rclist = rcptr;
    }
}